

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_test.cc
# Opt level: O2

int latency_macro_test(void)

{
  LatencyCollector *pLVar1;
  Msg *pMVar2;
  _Base_ptr p_Var3;
  long lVar4;
  ulong uVar5;
  string *lat_name;
  ulong uVar6;
  initializer_list<unsigned_long> __l;
  initializer_list<std::function<void_()>_> __l_00;
  Msg msg_stream;
  LatencyDumpDefaultImpl default_dump;
  LatencyCollectorDumpOptions local_150;
  LatencyItem chk;
  vector<unsigned_long,_std::allocator<unsigned_long>_> n_calls;
  __atomic_base<unsigned_long> local_c0;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> funcs;
  map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  hist;
  LatencyCollectWrapper LCW__block_latency__;
  string local_50 [32];
  
  pLVar1 = (LatencyCollector *)operator_new(0x58);
  LatencyCollector::LatencyCollector(pLVar1);
  chk.statName._M_dataplus._M_p = (pointer)0x17;
  chk.statName._M_string_length = 0x13;
  chk.statName.field_2._M_allocated_capacity = 0xd;
  __l._M_len = 3;
  __l._M_array = (iterator)&chk;
  global_lat = pLVar1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&n_calls,__l,(allocator_type *)&LCW__block_latency__);
  chk.statName._M_string_length = 0;
  chk.statName._M_dataplus._M_p = (pointer)test_function_1ms;
  chk.statName.field_2._8_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  chk.statName.field_2._M_allocated_capacity =
       (size_type)std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  chk.hist.EXP_BASE_LOG = 0.0;
  chk.hist.EXP_BASE = (double)test_function_2ms;
  chk.hist.count.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  chk.hist.bins = (HistBin *)std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  chk.hist.max.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  chk.hist.sum.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)test_function_3ms;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&chk;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            (&funcs,__l_00,(allocator_type *)&LCW__block_latency__);
  lVar4 = 0x40;
  do {
    std::_Function_base::~_Function_base
              ((_Function_base *)((long)&chk.statName._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  uVar6 = 0;
  while( true ) {
    pLVar1 = global_lat;
    if ((ulong)((long)n_calls.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)n_calls.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar6) break;
    std::__cxx11::string::string((string *)&chk,"outer for-loop",(allocator *)&hist);
    LatencyCollectWrapper::LatencyCollectWrapper(&LCW__block_latency__,pLVar1,&chk.statName);
    std::__cxx11::string::~string((string *)&chk);
    for (uVar5 = 0;
        uVar5 < n_calls.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6]; uVar5 = uVar5 + 1) {
      std::function<void_()>::operator()
                (funcs.
                 super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar6);
    }
    LatencyCollectWrapper::~LatencyCollectWrapper(&LCW__block_latency__);
    uVar6 = uVar6 + 1;
  }
  lVar4 = 0;
  for (uVar6 = 0;
      uVar6 < (ulong)((long)n_calls.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)n_calls.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
    std::function<void_()>::operator()
              ((function<void_()> *)
               ((long)&((funcs.
                         super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                       _M_functor + lVar4));
    lVar4 = lVar4 + 0x20;
  }
  for (uVar6 = 0;
      uVar6 < n_calls.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[2] + 1; uVar6 = uVar6 + 1) {
    test_function_4ms();
  }
  default_dump.super_LatencyDump._vptr_LatencyDump = (LatencyDump)&PTR_dump_abi_cxx11__0010fcd8;
  local_150.sort_by = TOTAL_TIME;
  local_150.view_type = TREE;
  LatencyCollector::dump_abi_cxx11_
            (&chk.statName,global_lat,&default_dump.super_LatencyDump,&local_150);
  pMVar2 = TestSuite::Msg::operator<<(&msg_stream,&chk.statName);
  TestSuite::Msg::operator<<(pMVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&chk);
  local_150.sort_by = AVG_LATENCY;
  LatencyCollector::dump_abi_cxx11_
            (&chk.statName,global_lat,&default_dump.super_LatencyDump,&local_150);
  pMVar2 = TestSuite::Msg::operator<<(&msg_stream,&chk.statName);
  TestSuite::Msg::operator<<(pMVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&chk);
  local_150.sort_by = NUM_CALLS;
  LatencyCollector::dump_abi_cxx11_
            (&chk.statName,global_lat,&default_dump.super_LatencyDump,&local_150);
  pMVar2 = TestSuite::Msg::operator<<(&msg_stream,&chk.statName);
  TestSuite::Msg::operator<<(pMVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&chk);
  local_150.sort_by = TOTAL_TIME;
  local_150.view_type = FLAT;
  LatencyCollector::dump_abi_cxx11_
            (&chk.statName,global_lat,&default_dump.super_LatencyDump,&local_150);
  pMVar2 = TestSuite::Msg::operator<<(&msg_stream,&chk.statName);
  TestSuite::Msg::operator<<(pMVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&chk);
  local_150.sort_by = AVG_LATENCY;
  LatencyCollector::dump_abi_cxx11_
            (&chk.statName,global_lat,&default_dump.super_LatencyDump,&local_150);
  pMVar2 = TestSuite::Msg::operator<<(&msg_stream,&chk.statName);
  TestSuite::Msg::operator<<(pMVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&chk);
  local_150.sort_by = NUM_CALLS;
  LatencyCollector::dump_abi_cxx11_
            (&chk.statName,global_lat,&default_dump.super_LatencyDump,&local_150);
  pMVar2 = TestSuite::Msg::operator<<(&msg_stream,&chk.statName);
  TestSuite::Msg::operator<<(pMVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&chk);
  std::__cxx11::string::string
            ((string *)&LCW__block_latency__,"test_function_3ms",(allocator *)&chk);
  std::__cxx11::string::string(local_50,"inner_function",(allocator *)&hist);
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 0x20) {
    lat_name = (string *)((long)&LCW__block_latency__.lat + lVar4);
    LatencyCollector::getAggrItem(&chk,global_lat,lat_name);
    pMVar2 = TestSuite::Msg::operator<<(&msg_stream,lat_name);
    pMVar2 = TestSuite::Msg::operator<<(pMVar2,(char (*) [3])0x10a1b8);
    pMVar2 = TestSuite::Msg::operator<<(pMVar2,(char (*) [7])"total ");
    hist._M_t._M_impl._0_8_ = chk.hist.sum.super___atomic_base<unsigned_long>._M_i;
    pMVar2 = TestSuite::Msg::operator<<(pMVar2,(unsigned_long *)&hist);
    pMVar2 = TestSuite::Msg::operator<<(pMVar2,(char (*) [6])" us, ");
    local_c0 = chk.hist.count.super___atomic_base<unsigned_long>._M_i;
    pMVar2 = TestSuite::Msg::operator<<(pMVar2,&local_c0._M_i);
    pMVar2 = TestSuite::Msg::operator<<(pMVar2,(char (*) [7])" calls");
    TestSuite::Msg::operator<<(pMVar2,std::endl<char,std::char_traits<char>>);
    LatencyItem::dumpHistogram(&hist,&chk);
    for (p_Var3 = hist._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &hist._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      pMVar2 = TestSuite::Msg::operator<<(&msg_stream,(char (*) [11])"less than ");
      pMVar2 = TestSuite::Msg::operator<<(pMVar2,(double *)(p_Var3 + 1));
      pMVar2 = TestSuite::Msg::operator<<(pMVar2,(char (*) [3])0x10a1b8);
      pMVar2 = TestSuite::Msg::operator<<(pMVar2,(unsigned_long *)&p_Var3[1]._M_parent);
      TestSuite::Msg::operator<<(pMVar2,std::endl<char,std::char_traits<char>>);
    }
    std::
    _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
    ::~_Rb_tree(&hist._M_t);
    LatencyItem::~LatencyItem(&chk);
  }
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&LCW__block_latency__.lat + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  LCW__block_latency__.lat = (LatencyCollector *)0x0;
  LatencyCollector::dump_abi_cxx11_
            (&chk.statName,global_lat,(LatencyDump *)0x0,
             (LatencyCollectorDumpOptions *)&LCW__block_latency__);
  pMVar2 = TestSuite::Msg::operator<<(&msg_stream,&chk.statName);
  TestSuite::Msg::operator<<(pMVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&chk);
  pLVar1 = global_lat;
  if (global_lat != (LatencyCollector *)0x0) {
    LatencyCollector::~LatencyCollector(global_lat);
  }
  operator_delete(pLVar1);
  global_lat = (LatencyCollector *)0x0;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector(&funcs);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&n_calls.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return 0;
}

Assistant:

int latency_macro_test() {
    global_lat = new LatencyCollector();

    size_t i, j;
    std::vector<size_t> n_calls = {23, 19, 13};
    std::vector<std::function<void()> >
            funcs = {test_function_1ms,
                     test_function_2ms,
                     test_function_3ms};

    for (i=0; i<n_calls.size(); ++i) {
        collectBlockLatency(global_lat, "outer for-loop");
        for (j=0; j<n_calls[i]; ++j) {
            funcs[i]();
        }
    }

    for (i=0; i<n_calls.size(); ++i) {
        funcs[i]();
    }

    for (i=0; i<n_calls[2]+1; ++i) {
        test_function_4ms();
    }

    LatencyDumpDefaultImpl default_dump;
    TestSuite::Msg msg_stream;

    LatencyCollectorDumpOptions opt;
    opt.view_type = LatencyCollectorDumpOptions::TREE;
    opt.sort_by = LatencyCollectorDumpOptions::TOTAL_TIME;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.sort_by = LatencyCollectorDumpOptions::AVG_LATENCY;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.sort_by = LatencyCollectorDumpOptions::NUM_CALLS;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.view_type = LatencyCollectorDumpOptions::FLAT;
    opt.sort_by = LatencyCollectorDumpOptions::TOTAL_TIME;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.sort_by = LatencyCollectorDumpOptions::AVG_LATENCY;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.sort_by = LatencyCollectorDumpOptions::NUM_CALLS;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    for ( const std::string& item_name: { std::string("test_function_3ms"),
                                          std::string("inner_function") } ) {
        LatencyItem chk = global_lat->getAggrItem(item_name);
        msg_stream << item_name << ": "
                   << "total " << chk.getTotalTime() << " us, "
                   << chk.getNumCalls() << " calls" << std::endl;
        std::map<double, uint64_t> hist = chk.dumpHistogram();
        for (auto& entry: hist) {
            msg_stream << "less than " << entry.first << ": "
                       << entry.second << std::endl;
        }
    }

    msg_stream << global_lat->dump(nullptr) << std::endl;

    delete global_lat;
    global_lat = nullptr;

    return 0;
}